

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

size_t encodeCobs(void *buffer,void *p,size_t size)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint8_t c;
  uint8_t code;
  uint8_t *codep;
  uint8_t *dst;
  uint8_t *src;
  size_t size_local;
  void *p_local;
  void *buffer_local;
  
  dst = (uint8_t *)((long)buffer + 1);
  code = '\x01';
  codep = (uint8_t *)buffer;
  src = (uint8_t *)p;
  size_local = size;
  do {
    if (size_local == 0) {
      *codep = code;
      return (long)dst - (long)buffer;
    }
    uVar1 = *src;
    puVar2 = dst;
    if (uVar1 == '\0') {
LAB_0011d01f:
      *codep = code;
      code = '\x01';
      codep = puVar2;
      if ((uVar1 == '\0') || (dst = puVar2, size_local - 1 != 0)) {
        dst = puVar2 + 1;
      }
    }
    else {
      puVar2 = dst + 1;
      *dst = uVar1;
      code = code + '\x01';
      dst = puVar2;
      if (code == 0xff) goto LAB_0011d01f;
    }
    src = src + 1;
    size_local = size_local - 1;
  } while( true );
}

Assistant:

size_t encodeCobs(
	void* buffer, // must be big enough
	void const* p,
	size_t size
) {
	uint8_t const* src = (uint8_t*)p;
	uint8_t* dst = (uint8_t*)buffer; // encoded byte pointer
	uint8_t* codep = dst++; // output code pointer
	uint8_t code = 1; // code value

	for (; size--; src++) {
		uint8_t c = *src;
		if (c) { // byte not zero, write it
			*dst++ = c;
			++code;
		}

		if (!c || code == 0xff) { // input is zero or block completed, restart
			*codep = code;
			code = 1;
			codep = dst;
			if (!c || size)
				++dst;
		}
	}

	*codep = code; // write final code value
	return dst - (uint8_t*)buffer;
}